

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O3

void __thiscall
EventPlayer::EventPlayer
          (EventPlayer *this,Time *time,string *filename,double resolution,EventFileType fileType)

{
  iterator iVar1;
  long *plVar2;
  unsigned_long a;
  fstream stream;
  double local_270;
  double local_268;
  string local_260;
  string local_240;
  byte abStack_220 [496];
  
  local_268 = resolution;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Event Generator","");
  StochasticProcess::StochasticProcess((StochasticProcess *)this,time,&local_240,&local_260);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0015ddf0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__StochasticEventGenerator_0015de88;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__StochasticEventGenerator_0015ded0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__EventPlayer_0015bf58;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__EventPlayer_0015bff0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__EventPlayer_0015c038;
  (this->playerFileName)._M_dataplus._M_p = (pointer)&(this->playerFileName).field_2;
  (this->playerFileName)._M_string_length = 0;
  (this->playerFileName).field_2._M_local_buf[0] = '\0';
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (fileType == ASCII) {
    std::fstream::fstream(&local_240,(filename->_M_dataplus)._M_p,_S_in);
    if ((abStack_220[*(long *)(local_240._M_dataplus._M_p + -0x18)] & 2) == 0) {
      do {
        std::istream::_M_extract<double>((double *)&local_240);
        local_270 = (double)local_260._M_dataplus._M_p * local_268;
        iVar1._M_current =
             (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->playerBuffer,iVar1,&local_270);
        }
        else {
          *iVar1._M_current = local_270;
          (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      } while ((abStack_220[*(long *)(local_240._M_dataplus._M_p + -0x18)] & 2) == 0);
    }
  }
  else {
    if (fileType != BINARY8LE) {
      return;
    }
    std::fstream::fstream(&local_240,(filename->_M_dataplus)._M_p,_S_in|_S_bin);
    while (plVar2 = (long *)std::istream::read((char *)&local_240,(long)&local_260),
          (*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
      local_270 = (((double)CONCAT44(0x45300000,(int)((ulong)local_260._M_dataplus._M_p >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_260._M_dataplus._M_p) - 4503599627370496.0
                  )) * local_268;
      iVar1._M_current =
           (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->playerBuffer,iVar1,&local_270);
      }
      else {
        *iVar1._M_current = local_270;
        (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
  }
  std::fstream::~fstream(&local_240);
  return;
}

Assistant:

EventPlayer::EventPlayer( Time *time, string filename, double resolution, EventFileType fileType)
	: StochasticEventGenerator(time)
{
	if (fileType==BINARY8LE) {
		
		// open file
		fstream stream( filename.c_str(), ios::in | ios::binary);
		
		// read file contents into buffer
		unsigned long int a;
		bool success = true;
		while (success) {
			success = (bool) stream.read((char *)&a, 8);
			if (success)
				playerBuffer.push_back(double(a) * resolution);
		}
	}
	else if (fileType==ASCII) {

		// open file
		fstream stream( filename.c_str(), ios::in );
		
		// read file contents into buffer
		double a;
		while (!stream.eof()) {
			stream >> a;
			playerBuffer.push_back(a * resolution);
		}
	}
}